

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh.cxx
# Opt level: O2

void __thiscall level_mesh::create_models(level_mesh *this)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer ppbVar3;
  long lVar4;
  size_t sVar5;
  undefined8 in_RSI;
  pointer ppbVar6;
  b_submesh_vec submeshes;
  b_submesh_vec fake_submeshes;
  b_submesh_vec mu_submeshes;
  _Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_> local_48;
  
  pbVar1 = (this->m_models).super__Vector_base<b_model,_std::allocator<b_model>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pbVar2 = (this->m_models).super__Vector_base<b_model,_std::allocator<b_model>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(this->m_mu_instances).
                super__Vector_base<b_mu_instance,_std::allocator<b_mu_instance>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->m_mu_instances).
                super__Vector_base<b_mu_instance,_std::allocator<b_mu_instance>_>._M_impl.
                super__Vector_impl_data._M_start;
  xray_re::msg("building edge-connected submeshes",in_RSI,lVar4 % 0x44);
  mu_submeshes.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mu_submeshes.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  mu_submeshes.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  fake_submeshes.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  fake_submeshes.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  fake_submeshes.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  submeshes.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  submeshes.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  submeshes.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar5 = create_submeshes(this,&mu_submeshes,&fake_submeshes,&submeshes);
  xray_re::msg("submeshes (MU): %Iu",
               (long)mu_submeshes.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)mu_submeshes.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3);
  xray_re::msg("submeshes (fake): %Iu",
               (long)fake_submeshes.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)fake_submeshes.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3);
  xray_re::msg("submeshes (regular): %Iu",
               (long)submeshes.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)submeshes.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl
                     .super__Vector_impl_data._M_start >> 3);
  xray_re::msg("reordering faces");
  reorder_faces(this);
  xray_re::msg("accounting submeshes");
  account_submeshes(this,&mu_submeshes,&fake_submeshes,&submeshes);
  xray_re::msg("creating collision models (MU)");
  setup_collision_models(this,&mu_submeshes);
  xray_re::msg("creating collision models (fake)");
  setup_collision_models(this,&fake_submeshes);
  merge_mu_fake_submeshes(this,&mu_submeshes,&fake_submeshes,&submeshes);
  xray_re::msg("creating collision models (regular)");
  setup_collision_models(this,&submeshes);
  merge_regular_submeshes(this,&submeshes,sVar5 + ((long)pbVar1 - (long)pbVar2 >> 4));
  if (this->m_debug_merge == true) {
    ppbVar3 = (this->m_instances).
              super__Vector_base<b_model_instance_*,_std::allocator<b_model_instance_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppbVar6 = (this->m_instances).
                   super__Vector_base<b_model_instance_*,_std::allocator<b_model_instance_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppbVar6 != ppbVar3;
        ppbVar6 = ppbVar6 + 1) {
      xray_re::_aabb<float>::grow(&(*ppbVar6)->aabb,this->m_glue_factor);
    }
    std::_Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::
    _Vector_impl_data::_M_swap_data
              ((_Vector_impl_data *)&(this->super_xr_mesh_builder).super_xr_mesh.m_points,
               (_Vector_impl_data *)&this->m_fat_points);
  }
  local_48._M_impl.super__Vector_impl_data._M_start =
       (this->m_fat_points).
       super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_48._M_impl.super__Vector_impl_data._M_finish =
       (this->m_fat_points).
       super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->m_fat_points).
       super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_fat_points).
  super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_fat_points).
  super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_fat_points).
  super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::
  ~_Vector_base(&local_48);
  validate_instances_order(this);
  pre_commit(this);
  collect_mu_models(this,lVar4 / 0x44);
  lock_models(this);
  std::_Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>::~_Vector_base
            (&submeshes.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>);
  std::_Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>::~_Vector_base
            (&fake_submeshes.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>);
  std::_Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>::~_Vector_base
            (&mu_submeshes.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>);
  return;
}

Assistant:

void level_mesh::create_models()
{
	size_t num_models_hint = m_models.size(), num_mu_instances = m_mu_instances.size();

	msg("building edge-connected submeshes");
	b_submesh_vec mu_submeshes, fake_submeshes, submeshes;
	num_models_hint += create_submeshes(mu_submeshes, fake_submeshes, submeshes);
	msg("submeshes (MU): %" PRIuSIZET, mu_submeshes.size());
	msg("submeshes (fake): %" PRIuSIZET, fake_submeshes.size());
	msg("submeshes (regular): %" PRIuSIZET, submeshes.size());

	msg("reordering faces");
	reorder_faces();

	msg("accounting submeshes");
	account_submeshes(mu_submeshes, fake_submeshes, submeshes);

#ifdef USE_WIN32_MT
	HANDLE setup_thread = NULL;
	if (m_use_mt) {
		msg("creating collision models (regular) - starting thread");
		setup_thread_param param;
		param.__this = this;
		param.submeshes = &submeshes;
		setup_thread = (HANDLE)_beginthreadex(NULL, 0, &level_mesh::setup_thread_cb, &param, 0, NULL);
		xr_assert(setup_thread != NULL);
	}
#endif
	msg("creating collision models (MU)");
	setup_collision_models(mu_submeshes);
	msg("creating collision models (fake)");
	setup_collision_models(fake_submeshes);

#ifdef USE_WIN32_MT
	if (setup_thread != NULL) {
		b_submesh_vec temp_submeshes;
		merge_mu_fake_submeshes(mu_submeshes, fake_submeshes, temp_submeshes);
		msg("creating collision models (regular) - waiting thread");
		WaitForSingleObject(setup_thread, INFINITE);
		submeshes.insert(submeshes.end(), temp_submeshes.begin(), temp_submeshes.end());
	} else
#endif
	{
		merge_mu_fake_submeshes(mu_submeshes, fake_submeshes, submeshes);
		msg("creating collision models (regular)");
		setup_collision_models(submeshes);
	}
	merge_regular_submeshes(submeshes, num_models_hint);

	if (m_debug_merge) {
		for (b_model_instance_vec_it it = m_instances.begin(),
				end = m_instances.end(); it != end; ++it) {
			(*it)->aabb.grow(m_glue_factor);
		}
		m_points.swap(m_fat_points);
	}
	std::vector<fvector3>().swap(m_fat_points);

	validate_instances_order();

	pre_commit();

	collect_mu_models(num_mu_instances);

	lock_models();
}